

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O0

mz_bool mz_zip_writer_add_cfile
                  (mz_zip_archive *pZip,char *pArchive_name,FILE *pSrc_file,mz_uint64 size_to_add,
                  time_t *pFile_time,void *pComment,mz_uint16 comment_size,mz_uint level_and_flags,
                  char *user_extra_data,mz_uint user_extra_data_len,char *user_extra_data_central,
                  mz_uint user_extra_data_central_len)

{
  mz_zip_internal_state *pmVar1;
  mz_uint16 filename_size;
  mz_uint8 mVar2;
  mz_bool mVar5;
  mz_uint flags;
  tdefl_status tVar6;
  int iVar7;
  mz_uint32 mVar8;
  size_t sVar9;
  long lVar10;
  size_t sVar11;
  ulong uVar12;
  mz_uint8 *ptr;
  mz_ulong mVar13;
  tdefl_compressor *d;
  mz_uint64 *local_418;
  mz_uint64 *local_408;
  mz_uint64 *local_3f8;
  tdefl_flush local_3e4;
  void *local_3c8;
  void *local_3b8;
  mz_uint64 *local_3b0;
  mz_uint64 *local_3a0;
  mz_uint64 *local_390;
  uint local_37c;
  undefined1 local_378;
  undefined1 local_377;
  undefined1 local_376;
  undefined1 local_375;
  mz_uint32 local_dir_footer_size;
  mz_uint8 local_dir_footer [24];
  tdefl_flush local_358;
  tdefl_flush flush;
  tdefl_status status;
  size_t in_buf_size;
  tdefl_compressor *pComp;
  mz_zip_writer_add_state state;
  mz_bool result;
  mz_uint n;
  void *pRead_buf;
  mz_uint64 uncomp_remaining;
  mz_zip_internal_state *pState;
  mz_uint8 extra_data [28];
  uint local_2e4;
  mz_zip_internal_state **ppmStack_2e0;
  mz_uint32 extra_size;
  mz_uint8 *pExtra_data;
  mz_uint8 local_dir_header [30];
  size_t archive_name_size;
  mz_uint64 comp_size;
  mz_uint64 uncomp_size;
  mz_uint64 cur_archive_file_ofs;
  mz_uint64 local_dir_header_ofs;
  mz_uint16 ext_attributes;
  mz_uint16 dos_date;
  mz_uint16 dos_time;
  mz_uint16 method;
  mz_uint num_alignment_padding_bytes;
  mz_uint level;
  mz_uint uncomp_crc32;
  mz_uint16 gen_flags;
  void *pComment_local;
  time_t *pFile_time_local;
  mz_uint64 size_to_add_local;
  FILE *pSrc_file_local;
  char *pArchive_name_local;
  mz_zip_archive *pZip_local;
  undefined4 local_22c;
  char *local_228;
  undefined4 local_21c;
  char *local_218;
  undefined4 local_cc;
  mz_uint8 *local_c8;
  undefined4 local_bc;
  mz_uint8 *local_b8;
  mz_uint local_ac;
  mz_uint32 *local_a8;
  undefined4 local_9c;
  undefined1 *local_98;
  mz_uint64 local_90;
  mz_uint8 *local_88;
  undefined4 local_7c;
  mz_uint8 *local_78;
  undefined4 local_6c;
  mz_uint8 *local_68;
  size_t local_60;
  mz_uint8 *local_58;
  undefined4 local_4c;
  mz_uint8 *local_48;
  undefined4 local_3c;
  mz_uint8 *local_38;
  mz_uint8 mVar3;
  mz_uint8 mVar4;
  
  level._2_2_ = 8;
  num_alignment_padding_bytes = 0;
  local_dir_header_ofs._6_2_ = 0;
  local_dir_header_ofs._4_2_ = 0;
  local_dir_header_ofs._2_2_ = 0;
  local_dir_header_ofs._0_2_ = 0;
  uncomp_size = pZip->m_archive_size;
  archive_name_size = 0;
  ppmStack_2e0 = (mz_zip_internal_state **)0x0;
  local_2e4 = 0;
  if ((level_and_flags & 0x10000) == 0) {
    level._2_2_ = 0x808;
  }
  if ((int)level_and_flags < 0) {
    level_and_flags = 6;
  }
  _dos_time = level_and_flags & 0xf;
  if (((((pZip == (mz_zip_archive *)0x0) || (pZip->m_pState == (mz_zip_internal_state *)0x0)) ||
       (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING)) || (pArchive_name == (char *)0x0)) ||
     (((comment_size != 0 && (pComment == (void *)0x0)) || (10 < _dos_time)))) {
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    }
    pZip_local._0_4_ = 0;
  }
  else {
    pmVar1 = pZip->m_pState;
    if ((pmVar1->m_zip64 == 0) && (0xffffffff < size_to_add)) {
      pmVar1->m_zip64 = 1;
    }
    if ((level_and_flags & 0x400) == 0) {
      comp_size = size_to_add;
      _uncomp_crc32 = pComment;
      pComment_local = pFile_time;
      pFile_time_local = (time_t *)size_to_add;
      size_to_add_local = (mz_uint64)pSrc_file;
      pSrc_file_local = (FILE *)pArchive_name;
      pArchive_name_local = (char *)pZip;
      mVar5 = mz_zip_writer_validate_archive_name(pArchive_name);
      if (mVar5 == 0) {
        if (pArchive_name_local != (char *)0x0) {
          pArchive_name_local[0x1c] = '\x19';
          pArchive_name_local[0x1d] = '\0';
          pArchive_name_local[0x1e] = '\0';
          pArchive_name_local[0x1f] = '\0';
        }
        pZip_local._0_4_ = 0;
      }
      else {
        if (pmVar1->m_zip64 == 0) {
          if (*(int *)(pArchive_name_local + 0x10) == 0xffff) {
            pmVar1->m_zip64 = 1;
          }
        }
        else if (*(int *)(pArchive_name_local + 0x10) == -1) {
          if (pArchive_name_local != (char *)0x0) {
            pArchive_name_local[0x1c] = '\x02';
            pArchive_name_local[0x1d] = '\0';
            pArchive_name_local[0x1e] = '\0';
            pArchive_name_local[0x1f] = '\0';
          }
          return 0;
        }
        sVar9 = strlen((char *)pSrc_file_local);
        if (sVar9 < 0x10000) {
          _ext_attributes =
               mz_zip_writer_compute_padding_needed_for_file_alignment
                         ((mz_zip_archive *)pArchive_name_local);
          if ((pmVar1->m_central_dir).m_size + sVar9 + 0x4a + (ulong)comment_size < 0xffffffff) {
            if ((pmVar1->m_zip64 == 0) &&
               (0xffffffff <
                *(long *)pArchive_name_local + (ulong)_ext_attributes + sVar9 * 2 +
                (ulong)comment_size + (ulong)user_extra_data_len + (pmVar1->m_central_dir).m_size +
                0x472 + (ulong)user_extra_data_central_len)) {
              pmVar1->m_zip64 = 1;
            }
            if (pComment_local != (void *)0x0) {
              mz_zip_time_t_to_dos_time
                        (*pComment_local,(mz_uint16 *)((long)&local_dir_header_ofs + 4),
                         (mz_uint16 *)((long)&local_dir_header_ofs + 2));
            }
            if (comp_size < 4) {
              _dos_time = 0;
            }
            mVar5 = mz_zip_writer_write_zeros
                              ((mz_zip_archive *)pArchive_name_local,uncomp_size,_ext_attributes);
            if (mVar5 == 0) {
              if (pArchive_name_local != (char *)0x0) {
                pArchive_name_local[0x1c] = '\x13';
                pArchive_name_local[0x1d] = '\0';
                pArchive_name_local[0x1e] = '\0';
                pArchive_name_local[0x1f] = '\0';
              }
              pZip_local._0_4_ = 0;
            }
            else {
              uncomp_size = _ext_attributes + uncomp_size;
              cur_archive_file_ofs = uncomp_size;
              if ((*(long *)(pArchive_name_local + 0x20) != 0) &&
                 ((uncomp_size & *(long *)(pArchive_name_local + 0x20) - 1U) != 0)) {
                __assert_fail("(cur_archive_file_ofs & (pZip->m_file_offset_alignment - 1)) == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/knicked[P]CCraft/deps/miniz/miniz.c"
                              ,0x1900,
                              "mz_bool mz_zip_writer_add_cfile(mz_zip_archive *, const char *, FILE *, mz_uint64, const time_t *, const void *, mz_uint16, mz_uint, const char *, mz_uint, const char *, mz_uint)"
                             );
              }
              if ((comp_size != 0) && (_dos_time != 0)) {
                local_dir_header_ofs._6_2_ = 8;
              }
              memset(&pExtra_data,0,0x1e);
              filename_size = (mz_uint16)sVar9;
              if (pmVar1->m_zip64 == 0) {
                if ((0xffffffff < archive_name_size) || (0xffffffff < uncomp_size)) {
                  if (pArchive_name_local != (char *)0x0) {
                    pArchive_name_local[0x1c] = '\x1d';
                    pArchive_name_local[0x1d] = '\0';
                    pArchive_name_local[0x1e] = '\0';
                    pArchive_name_local[0x1f] = '\0';
                  }
                  return 0;
                }
                mVar5 = mz_zip_writer_create_local_dir_header
                                  ((mz_zip_archive *)pArchive_name_local,(mz_uint8 *)&pExtra_data,
                                   filename_size,(mz_uint16)user_extra_data_len,0,0,0,
                                   local_dir_header_ofs._6_2_,level._2_2_,local_dir_header_ofs._4_2_
                                   ,local_dir_header_ofs._2_2_);
                if (mVar5 == 0) {
                  if (pArchive_name_local != (char *)0x0) {
                    pArchive_name_local[0x1c] = '\x1b';
                    pArchive_name_local[0x1d] = '\0';
                    pArchive_name_local[0x1e] = '\0';
                    pArchive_name_local[0x1f] = '\0';
                  }
                  return 0;
                }
                lVar10 = (**(code **)(pArchive_name_local + 0x50))
                                   (*(undefined8 *)(pArchive_name_local + 0x60),uncomp_size,
                                    &pExtra_data,0x1e);
                if (lVar10 != 0x1e) {
                  if (pArchive_name_local != (char *)0x0) {
                    pArchive_name_local[0x1c] = '\x13';
                    pArchive_name_local[0x1d] = '\0';
                    pArchive_name_local[0x1e] = '\0';
                    pArchive_name_local[0x1f] = '\0';
                  }
                  return 0;
                }
                uncomp_size = uncomp_size + 0x1e;
                sVar11 = (**(code **)(pArchive_name_local + 0x50))
                                   (*(undefined8 *)(pArchive_name_local + 0x60),uncomp_size,
                                    pSrc_file_local,sVar9);
                if (sVar11 != sVar9) {
                  if (pArchive_name_local != (char *)0x0) {
                    pArchive_name_local[0x1c] = '\x13';
                    pArchive_name_local[0x1d] = '\0';
                    pArchive_name_local[0x1e] = '\0';
                    pArchive_name_local[0x1f] = '\0';
                  }
                  return 0;
                }
                uncomp_size = sVar9 + uncomp_size;
              }
              else {
                if ((0xfffffffe < comp_size) || (0xfffffffe < cur_archive_file_ofs)) {
                  ppmStack_2e0 = &pState;
                  if (comp_size < 0xffffffff) {
                    local_390 = (mz_uint64 *)0x0;
                    local_3a0 = (mz_uint64 *)0x0;
                  }
                  else {
                    local_390 = &comp_size;
                    local_3a0 = &archive_name_size;
                  }
                  if (cur_archive_file_ofs < 0xffffffff) {
                    local_3b0 = (mz_uint64 *)0x0;
                  }
                  else {
                    local_3b0 = &cur_archive_file_ofs;
                  }
                  local_2e4 = mz_zip_writer_create_zip64_extra_data
                                        ((mz_uint8 *)&pState,local_390,local_3a0,local_3b0);
                }
                mVar5 = mz_zip_writer_create_local_dir_header
                                  ((mz_zip_archive *)pArchive_name_local,(mz_uint8 *)&pExtra_data,
                                   filename_size,(short)local_2e4 + (mz_uint16)user_extra_data_len,0
                                   ,0,0,local_dir_header_ofs._6_2_,level._2_2_,
                                   local_dir_header_ofs._4_2_,local_dir_header_ofs._2_2_);
                if (mVar5 == 0) {
                  if (pArchive_name_local != (char *)0x0) {
                    pArchive_name_local[0x1c] = '\x1b';
                    pArchive_name_local[0x1d] = '\0';
                    pArchive_name_local[0x1e] = '\0';
                    pArchive_name_local[0x1f] = '\0';
                  }
                  return 0;
                }
                lVar10 = (**(code **)(pArchive_name_local + 0x50))
                                   (*(undefined8 *)(pArchive_name_local + 0x60),uncomp_size,
                                    &pExtra_data,0x1e);
                if (lVar10 != 0x1e) {
                  if (pArchive_name_local != (char *)0x0) {
                    pArchive_name_local[0x1c] = '\x13';
                    pArchive_name_local[0x1d] = '\0';
                    pArchive_name_local[0x1e] = '\0';
                    pArchive_name_local[0x1f] = '\0';
                  }
                  return 0;
                }
                uncomp_size = uncomp_size + 0x1e;
                sVar11 = (**(code **)(pArchive_name_local + 0x50))
                                   (*(undefined8 *)(pArchive_name_local + 0x60),uncomp_size,
                                    pSrc_file_local,sVar9);
                if (sVar11 != sVar9) {
                  if (pArchive_name_local != (char *)0x0) {
                    pArchive_name_local[0x1c] = '\x13';
                    pArchive_name_local[0x1d] = '\0';
                    pArchive_name_local[0x1e] = '\0';
                    pArchive_name_local[0x1f] = '\0';
                  }
                  return 0;
                }
                uncomp_size = sVar9 + uncomp_size;
                uVar12 = (**(code **)(pArchive_name_local + 0x50))
                                   (*(undefined8 *)(pArchive_name_local + 0x60),uncomp_size,&pState,
                                    local_2e4);
                if (uVar12 != local_2e4) {
                  if (pArchive_name_local != (char *)0x0) {
                    pArchive_name_local[0x1c] = '\x13';
                    pArchive_name_local[0x1d] = '\0';
                    pArchive_name_local[0x1e] = '\0';
                    pArchive_name_local[0x1f] = '\0';
                  }
                  return 0;
                }
                uncomp_size = local_2e4 + uncomp_size;
              }
              if (user_extra_data_len != 0) {
                uVar12 = (**(code **)(pArchive_name_local + 0x50))
                                   (*(undefined8 *)(pArchive_name_local + 0x60),uncomp_size,
                                    user_extra_data,user_extra_data_len);
                if (uVar12 != user_extra_data_len) {
                  if (pArchive_name_local != (char *)0x0) {
                    pArchive_name_local[0x1c] = '\x13';
                    pArchive_name_local[0x1d] = '\0';
                    pArchive_name_local[0x1e] = '\0';
                    pArchive_name_local[0x1f] = '\0';
                  }
                  return 0;
                }
                uncomp_size = user_extra_data_len + uncomp_size;
              }
              if (comp_size != 0) {
                pRead_buf = (void *)comp_size;
                ptr = (mz_uint8 *)
                      (**(code **)(pArchive_name_local + 0x28))
                                (*(undefined8 *)(pArchive_name_local + 0x40),1,0x10000);
                if (ptr == (mz_uint8 *)0x0) {
                  if (pArchive_name_local != (char *)0x0) {
                    pArchive_name_local[0x1c] = '\x10';
                    pArchive_name_local[0x1d] = '\0';
                    pArchive_name_local[0x1e] = '\0';
                    pArchive_name_local[0x1f] = '\0';
                  }
                  return 0;
                }
                if (_dos_time == 0) {
                  for (; pRead_buf != (void *)0x0;
                      pRead_buf = (void *)((long)pRead_buf - (ulong)state.m_comp_size._4_4_)) {
                    if (pRead_buf < (void *)0x10001) {
                      local_3b8 = pRead_buf;
                    }
                    else {
                      local_3b8 = (void *)0x10000;
                    }
                    state.m_comp_size._4_4_ = (uint)local_3b8;
                    sVar9 = fread(ptr,1,(ulong)local_3b8 & 0xffffffff,(FILE *)size_to_add_local);
                    if ((sVar9 != state.m_comp_size._4_4_) ||
                       (uVar12 = (**(code **)(pArchive_name_local + 0x50))
                                           (*(undefined8 *)(pArchive_name_local + 0x60),uncomp_size,
                                            ptr,state.m_comp_size._4_4_),
                       uVar12 != state.m_comp_size._4_4_)) {
                      (**(code **)(pArchive_name_local + 0x30))
                                (*(undefined8 *)(pArchive_name_local + 0x40),ptr);
                      if (pArchive_name_local != (char *)0x0) {
                        pArchive_name_local[0x1c] = '\x14';
                        pArchive_name_local[0x1d] = '\0';
                        pArchive_name_local[0x1e] = '\0';
                        pArchive_name_local[0x1f] = '\0';
                      }
                      return 0;
                    }
                    mVar13 = mz_crc32((ulong)num_alignment_padding_bytes,ptr,
                                      (ulong)state.m_comp_size._4_4_);
                    num_alignment_padding_bytes = (mz_uint)mVar13;
                    uncomp_size = state.m_comp_size._4_4_ + uncomp_size;
                  }
                  archive_name_size = comp_size;
                }
                else {
                  state.m_comp_size._0_4_ = 0;
                  d = (tdefl_compressor *)
                      (**(code **)(pArchive_name_local + 0x28))
                                (*(undefined8 *)(pArchive_name_local + 0x40),1,0x4df78);
                  if (d == (tdefl_compressor *)0x0) {
                    (**(code **)(pArchive_name_local + 0x30))
                              (*(undefined8 *)(pArchive_name_local + 0x40),ptr);
                    if (pArchive_name_local != (char *)0x0) {
                      pArchive_name_local[0x1c] = '\x10';
                      pArchive_name_local[0x1d] = '\0';
                      pArchive_name_local[0x1e] = '\0';
                      pArchive_name_local[0x1f] = '\0';
                    }
                    return 0;
                  }
                  pComp = (tdefl_compressor *)pArchive_name_local;
                  state.m_pZip = (mz_zip_archive *)uncomp_size;
                  state.m_cur_archive_file_ofs = 0;
                  flags = tdefl_create_comp_flags_from_zip_params(_dos_time,-0xf,0);
                  tVar6 = tdefl_init(d,mz_zip_writer_add_put_buf_callback,&pComp,flags);
                  if (tVar6 != TDEFL_STATUS_OKAY) {
                    (**(code **)(pArchive_name_local + 0x30))
                              (*(undefined8 *)(pArchive_name_local + 0x40),d);
                    (**(code **)(pArchive_name_local + 0x30))
                              (*(undefined8 *)(pArchive_name_local + 0x40),ptr);
                    if (pArchive_name_local != (char *)0x0) {
                      pArchive_name_local[0x1c] = '\x1b';
                      pArchive_name_local[0x1d] = '\0';
                      pArchive_name_local[0x1e] = '\0';
                      pArchive_name_local[0x1f] = '\0';
                    }
                    return 0;
                  }
                  do {
                    if (pRead_buf < (void *)0x10000) {
                      local_3c8 = pRead_buf;
                    }
                    else {
                      local_3c8 = (void *)0x10000;
                    }
                    uVar12 = (ulong)local_3c8 & 0xffffffff;
                    local_358 = TDEFL_NO_FLUSH;
                    sVar9 = fread(ptr,1,uVar12,(FILE *)size_to_add_local);
                    if (sVar9 != uVar12) {
                      local_218 = pArchive_name_local;
                      local_21c = 0x14;
                      if (pArchive_name_local != (char *)0x0) {
                        pArchive_name_local[0x1c] = '\x14';
                        pArchive_name_local[0x1d] = '\0';
                        pArchive_name_local[0x1e] = '\0';
                        pArchive_name_local[0x1f] = '\0';
                      }
                      goto LAB_00123a12;
                    }
                    mVar13 = mz_crc32((ulong)num_alignment_padding_bytes,ptr,uVar12);
                    num_alignment_padding_bytes = (mz_uint)mVar13;
                    pRead_buf = (void *)((long)pRead_buf - uVar12);
                    if ((*(long *)(pArchive_name_local + 0x58) != 0) &&
                       (iVar7 = (**(code **)(pArchive_name_local + 0x58))
                                          (*(undefined8 *)(pArchive_name_local + 0x60)), iVar7 != 0)
                       ) {
                      local_358 = TDEFL_FULL_FLUSH;
                    }
                    if (pRead_buf == (void *)0x0) {
                      local_3e4 = TDEFL_FINISH;
                    }
                    else {
                      local_3e4 = local_358;
                    }
                    tVar6 = tdefl_compress_buffer(d,ptr,uVar12,local_3e4);
                    if (tVar6 == TDEFL_STATUS_DONE) {
                      state.m_comp_size._0_4_ = 1;
                      goto LAB_00123a12;
                    }
                  } while (tVar6 == TDEFL_STATUS_OKAY);
                  local_228 = pArchive_name_local;
                  local_22c = 0xc;
                  if (pArchive_name_local != (char *)0x0) {
                    pArchive_name_local[0x1c] = '\f';
                    pArchive_name_local[0x1d] = '\0';
                    pArchive_name_local[0x1e] = '\0';
                    pArchive_name_local[0x1f] = '\0';
                  }
LAB_00123a12:
                  (**(code **)(pArchive_name_local + 0x30))
                            (*(undefined8 *)(pArchive_name_local + 0x40),d);
                  if ((int)state.m_comp_size == 0) {
                    (**(code **)(pArchive_name_local + 0x30))
                              (*(undefined8 *)(pArchive_name_local + 0x40),ptr);
                    return 0;
                  }
                  archive_name_size = state.m_cur_archive_file_ofs;
                  uncomp_size = (mz_uint64)state.m_pZip;
                }
                (**(code **)(pArchive_name_local + 0x30))
                          (*(undefined8 *)(pArchive_name_local + 0x40),ptr);
              }
              local_37c = 0x10;
              local_98 = &local_378;
              local_9c = 0x8074b50;
              local_378 = 0x50;
              local_377 = 0x4b;
              local_376 = 7;
              local_375 = 8;
              local_a8 = &local_dir_footer_size;
              local_ac = num_alignment_padding_bytes;
              local_dir_footer_size._0_1_ = (undefined1)num_alignment_padding_bytes;
              local_dir_footer_size._1_1_ = (undefined1)(num_alignment_padding_bytes >> 8);
              local_dir_footer_size._2_1_ = (undefined1)(num_alignment_padding_bytes >> 0x10);
              local_dir_footer_size._3_1_ = (undefined1)(num_alignment_padding_bytes >> 0x18);
              local_dir_footer[0] = (mz_uint8)archive_name_size;
              local_dir_footer[1] = (mz_uint8)(archive_name_size >> 8);
              local_dir_footer[2] = (mz_uint8)(archive_name_size >> 0x10);
              local_dir_footer[3] = (mz_uint8)(archive_name_size >> 0x18);
              mVar2 = (mz_uint8)(comp_size >> 8);
              mVar3 = (mz_uint8)(comp_size >> 0x10);
              mVar4 = (mz_uint8)(comp_size >> 0x18);
              if (ppmStack_2e0 == (mz_zip_internal_state **)0x0) {
                if (0xffffffff < archive_name_size) {
                  if (pArchive_name_local != (char *)0x0) {
                    pArchive_name_local[0x1c] = '\x1d';
                    pArchive_name_local[0x1d] = '\0';
                    pArchive_name_local[0x1e] = '\0';
                    pArchive_name_local[0x1f] = '\0';
                  }
                  return 0;
                }
                local_b8 = local_dir_footer;
                local_c8 = local_dir_footer + 4;
                local_cc = (int)comp_size;
                local_bc = (int)archive_name_size;
                local_dir_footer[4] = (mz_uint8)comp_size;
                local_dir_footer[5] = mVar2;
                local_dir_footer[6] = mVar3;
                local_dir_footer[7] = mVar4;
              }
              else {
                local_58 = local_dir_footer;
                local_60 = archive_name_size;
                local_48 = local_dir_footer + 4;
                local_4c = (undefined4)(archive_name_size >> 0x20);
                local_dir_footer[4] = (mz_uint8)(archive_name_size >> 0x20);
                local_dir_footer[5] = (mz_uint8)(archive_name_size >> 0x28);
                local_dir_footer[6] = (mz_uint8)(archive_name_size >> 0x30);
                local_dir_footer[7] = (mz_uint8)(archive_name_size >> 0x38);
                local_88 = local_dir_footer + 8;
                local_90 = comp_size;
                local_78 = local_dir_footer + 0xc;
                local_7c = (undefined4)(comp_size >> 0x20);
                local_dir_footer[0xc] = (mz_uint8)(comp_size >> 0x20);
                local_dir_footer[0xd] = (mz_uint8)(comp_size >> 0x28);
                local_dir_footer[0xe] = (mz_uint8)(comp_size >> 0x30);
                local_dir_footer[0xf] = (mz_uint8)(comp_size >> 0x38);
                local_37c = 0x18;
                local_6c = (int)comp_size;
                local_68 = local_88;
                local_3c = (int)archive_name_size;
                local_38 = local_58;
                local_dir_footer[8] = (mz_uint8)comp_size;
                local_dir_footer[9] = mVar2;
                local_dir_footer[10] = mVar3;
                local_dir_footer[0xb] = mVar4;
              }
              uVar12 = (**(code **)(pArchive_name_local + 0x50))
                                 (*(undefined8 *)(pArchive_name_local + 0x60),uncomp_size,&local_378
                                  ,local_37c);
              if (uVar12 == local_37c) {
                uncomp_size = local_37c + uncomp_size;
                if (ppmStack_2e0 != (mz_zip_internal_state **)0x0) {
                  if (comp_size < 0xffffffff) {
                    local_3f8 = (mz_uint64 *)0x0;
                    local_408 = (mz_uint64 *)0x0;
                  }
                  else {
                    local_3f8 = &comp_size;
                    local_408 = &archive_name_size;
                  }
                  if (cur_archive_file_ofs < 0xffffffff) {
                    local_418 = (mz_uint64 *)0x0;
                  }
                  else {
                    local_418 = &cur_archive_file_ofs;
                  }
                  mVar8 = mz_zip_writer_create_zip64_extra_data
                                    ((mz_uint8 *)&pState,local_3f8,local_408,local_418);
                  local_2e4._0_2_ = (mz_uint16)mVar8;
                }
                mVar5 = mz_zip_writer_add_to_central_dir
                                  ((mz_zip_archive *)pArchive_name_local,(char *)pSrc_file_local,
                                   filename_size,ppmStack_2e0,(mz_uint16)local_2e4,_uncomp_crc32,
                                   comment_size,comp_size,archive_name_size,
                                   num_alignment_padding_bytes,local_dir_header_ofs._6_2_,
                                   level._2_2_,local_dir_header_ofs._4_2_,local_dir_header_ofs._2_2_
                                   ,cur_archive_file_ofs,(uint)(ushort)local_dir_header_ofs,
                                   user_extra_data_central,user_extra_data_central_len);
                if (mVar5 == 0) {
                  pZip_local._0_4_ = 0;
                }
                else {
                  *(int *)(pArchive_name_local + 0x10) = *(int *)(pArchive_name_local + 0x10) + 1;
                  *(mz_uint64 *)pArchive_name_local = uncomp_size;
                  pZip_local._0_4_ = 1;
                }
              }
              else {
                pZip_local._0_4_ = 0;
              }
            }
          }
          else {
            if (pArchive_name_local != (char *)0x0) {
              pArchive_name_local[0x1c] = '\x0f';
              pArchive_name_local[0x1d] = '\0';
              pArchive_name_local[0x1e] = '\0';
              pArchive_name_local[0x1f] = '\0';
            }
            pZip_local._0_4_ = 0;
          }
        }
        else {
          if (pArchive_name_local != (char *)0x0) {
            pArchive_name_local[0x1c] = '\x19';
            pArchive_name_local[0x1d] = '\0';
            pArchive_name_local[0x1e] = '\0';
            pArchive_name_local[0x1f] = '\0';
          }
          pZip_local._0_4_ = 0;
        }
      }
    }
    else {
      if (pZip != (mz_zip_archive *)0x0) {
        pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
      }
      pZip_local._0_4_ = 0;
    }
  }
  return (mz_bool)pZip_local;
}

Assistant:

mz_bool mz_zip_writer_add_cfile(mz_zip_archive *pZip, const char *pArchive_name, MZ_FILE *pSrc_file, mz_uint64 size_to_add, const MZ_TIME_T *pFile_time, const void *pComment, mz_uint16 comment_size, mz_uint level_and_flags,
                                const char *user_extra_data, mz_uint user_extra_data_len, const char *user_extra_data_central, mz_uint user_extra_data_central_len)
{
    mz_uint16 gen_flags = MZ_ZIP_LDH_BIT_FLAG_HAS_LOCATOR;
    mz_uint uncomp_crc32 = MZ_CRC32_INIT, level, num_alignment_padding_bytes;
    mz_uint16 method = 0, dos_time = 0, dos_date = 0, ext_attributes = 0;
    mz_uint64 local_dir_header_ofs, cur_archive_file_ofs = pZip->m_archive_size, uncomp_size = size_to_add, comp_size = 0;
    size_t archive_name_size;
    mz_uint8 local_dir_header[MZ_ZIP_LOCAL_DIR_HEADER_SIZE];
    mz_uint8 *pExtra_data = NULL;
    mz_uint32 extra_size = 0;
    mz_uint8 extra_data[MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE];
    mz_zip_internal_state *pState;

    if (!(level_and_flags & MZ_ZIP_FLAG_ASCII_FILENAME))
        gen_flags |= MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_UTF8;

    if ((int)level_and_flags < 0)
        level_and_flags = MZ_DEFAULT_LEVEL;
    level = level_and_flags & 0xF;

    /* Sanity checks */
    if ((!pZip) || (!pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) || (!pArchive_name) || ((comment_size) && (!pComment)) || (level > MZ_UBER_COMPRESSION))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    pState = pZip->m_pState;

    if ((!pState->m_zip64) && (uncomp_size > MZ_UINT32_MAX))
    {
        /* Source file is too large for non-zip64 */
        /*return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE); */
        pState->m_zip64 = MZ_TRUE;
    }

    /* We could support this, but why? */
    if (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    if (!mz_zip_writer_validate_archive_name(pArchive_name))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_FILENAME);

    if (pState->m_zip64)
    {
        if (pZip->m_total_files == MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }
    else
    {
        if (pZip->m_total_files == MZ_UINT16_MAX)
        {
            pState->m_zip64 = MZ_TRUE;
            /*return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES); */
        }
    }

    archive_name_size = strlen(pArchive_name);
    if (archive_name_size > MZ_UINT16_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_FILENAME);

    num_alignment_padding_bytes = mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

    /* miniz doesn't support central dirs >= MZ_UINT32_MAX bytes yet */
    if (((mz_uint64)pState->m_central_dir.m_size + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + archive_name_size + MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE + comment_size) >= MZ_UINT32_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

    if (!pState->m_zip64)
    {
        /* Bail early if the archive would obviously become too large */
        if ((pZip->m_archive_size + num_alignment_padding_bytes + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + archive_name_size + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE 
			+ archive_name_size + comment_size + user_extra_data_len + pState->m_central_dir.m_size + MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE + 1024
			+ MZ_ZIP_DATA_DESCRIPTER_SIZE32 + user_extra_data_central_len) > 0xFFFFFFFF)
        {
            pState->m_zip64 = MZ_TRUE;
            /*return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE); */
        }
    }

#ifndef MINIZ_NO_TIME
    if (pFile_time)
    {
        mz_zip_time_t_to_dos_time(*pFile_time, &dos_time, &dos_date);
    }
#endif

    if (uncomp_size <= 3)
        level = 0;

    if (!mz_zip_writer_write_zeros(pZip, cur_archive_file_ofs, num_alignment_padding_bytes))
    {
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
    }

    cur_archive_file_ofs += num_alignment_padding_bytes;
    local_dir_header_ofs = cur_archive_file_ofs;

    if (pZip->m_file_offset_alignment)
    {
        MZ_ASSERT((cur_archive_file_ofs & (pZip->m_file_offset_alignment - 1)) == 0);
    }

    if (uncomp_size && level)
    {
        method = MZ_DEFLATED;
    }

    MZ_CLEAR_OBJ(local_dir_header);
    if (pState->m_zip64)
    {
        if (uncomp_size >= MZ_UINT32_MAX || local_dir_header_ofs >= MZ_UINT32_MAX)
        {
            pExtra_data = extra_data;
            extra_size = mz_zip_writer_create_zip64_extra_data(extra_data, (uncomp_size >= MZ_UINT32_MAX) ? &uncomp_size : NULL,
                                                               (uncomp_size >= MZ_UINT32_MAX) ? &comp_size : NULL, (local_dir_header_ofs >= MZ_UINT32_MAX) ? &local_dir_header_ofs : NULL);
        }

        if (!mz_zip_writer_create_local_dir_header(pZip, local_dir_header, (mz_uint16)archive_name_size, extra_size + user_extra_data_len, 0, 0, 0, method, gen_flags, dos_time, dos_date))
            return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, local_dir_header, sizeof(local_dir_header)) != sizeof(local_dir_header))
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        cur_archive_file_ofs += sizeof(local_dir_header);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name, archive_name_size) != archive_name_size)
        {
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }

        cur_archive_file_ofs += archive_name_size;

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, extra_data, extra_size) != extra_size)
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        cur_archive_file_ofs += extra_size;
    }
    else
    {
        if ((comp_size > MZ_UINT32_MAX) || (cur_archive_file_ofs > MZ_UINT32_MAX))
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);
        if (!mz_zip_writer_create_local_dir_header(pZip, local_dir_header, (mz_uint16)archive_name_size, user_extra_data_len, 0, 0, 0, method, gen_flags, dos_time, dos_date))
            return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, local_dir_header, sizeof(local_dir_header)) != sizeof(local_dir_header))
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        cur_archive_file_ofs += sizeof(local_dir_header);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name, archive_name_size) != archive_name_size)
        {
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }

        cur_archive_file_ofs += archive_name_size;
    }

    if (user_extra_data_len > 0)
    {
        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, user_extra_data, user_extra_data_len) != user_extra_data_len)
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        cur_archive_file_ofs += user_extra_data_len;
    }

    if (uncomp_size)
    {
        mz_uint64 uncomp_remaining = uncomp_size;
        void *pRead_buf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, MZ_ZIP_MAX_IO_BUF_SIZE);
        if (!pRead_buf)
        {
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (!level)
        {
            while (uncomp_remaining)
            {
                mz_uint n = (mz_uint)MZ_MIN((mz_uint64)MZ_ZIP_MAX_IO_BUF_SIZE, uncomp_remaining);
                if ((MZ_FREAD(pRead_buf, 1, n, pSrc_file) != n) || (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pRead_buf, n) != n))
                {
                    pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
                    return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
                }
                uncomp_crc32 = (mz_uint32)mz_crc32(uncomp_crc32, (const mz_uint8 *)pRead_buf, n);
                uncomp_remaining -= n;
                cur_archive_file_ofs += n;
            }
            comp_size = uncomp_size;
        }
        else
        {
            mz_bool result = MZ_FALSE;
            mz_zip_writer_add_state state;
            tdefl_compressor *pComp = (tdefl_compressor *)pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, sizeof(tdefl_compressor));
            if (!pComp)
            {
                pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
                return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
            }

            state.m_pZip = pZip;
            state.m_cur_archive_file_ofs = cur_archive_file_ofs;
            state.m_comp_size = 0;

            if (tdefl_init(pComp, mz_zip_writer_add_put_buf_callback, &state, tdefl_create_comp_flags_from_zip_params(level, -15, MZ_DEFAULT_STRATEGY)) != TDEFL_STATUS_OKAY)
            {
                pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
                pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
                return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);
            }

            for (;;)
            {
                size_t in_buf_size = (mz_uint32)MZ_MIN(uncomp_remaining, (mz_uint64)MZ_ZIP_MAX_IO_BUF_SIZE);
                tdefl_status status;
                tdefl_flush flush = TDEFL_NO_FLUSH;

                if (MZ_FREAD(pRead_buf, 1, in_buf_size, pSrc_file) != in_buf_size)
                {
                    mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
                    break;
                }

                uncomp_crc32 = (mz_uint32)mz_crc32(uncomp_crc32, (const mz_uint8 *)pRead_buf, in_buf_size);
                uncomp_remaining -= in_buf_size;

                if (pZip->m_pNeeds_keepalive != NULL && pZip->m_pNeeds_keepalive(pZip->m_pIO_opaque))
                    flush = TDEFL_FULL_FLUSH;

                status = tdefl_compress_buffer(pComp, pRead_buf, in_buf_size, uncomp_remaining ? flush : TDEFL_FINISH);
                if (status == TDEFL_STATUS_DONE)
                {
                    result = MZ_TRUE;
                    break;
                }
                else if (status != TDEFL_STATUS_OKAY)
                {
                    mz_zip_set_error(pZip, MZ_ZIP_COMPRESSION_FAILED);
                    break;
                }
            }

            pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);

            if (!result)
            {
                pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
                return MZ_FALSE;
            }

            comp_size = state.m_comp_size;
            cur_archive_file_ofs = state.m_cur_archive_file_ofs;
        }

        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
    }

    {
        mz_uint8 local_dir_footer[MZ_ZIP_DATA_DESCRIPTER_SIZE64];
        mz_uint32 local_dir_footer_size = MZ_ZIP_DATA_DESCRIPTER_SIZE32;

        MZ_WRITE_LE32(local_dir_footer + 0, MZ_ZIP_DATA_DESCRIPTOR_ID);
        MZ_WRITE_LE32(local_dir_footer + 4, uncomp_crc32);
        if (pExtra_data == NULL)
        {
            if (comp_size > MZ_UINT32_MAX)
                return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);

            MZ_WRITE_LE32(local_dir_footer + 8, comp_size);
            MZ_WRITE_LE32(local_dir_footer + 12, uncomp_size);
        }
        else
        {
            MZ_WRITE_LE64(local_dir_footer + 8, comp_size);
            MZ_WRITE_LE64(local_dir_footer + 16, uncomp_size);
            local_dir_footer_size = MZ_ZIP_DATA_DESCRIPTER_SIZE64;
        }

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, local_dir_footer, local_dir_footer_size) != local_dir_footer_size)
            return MZ_FALSE;

        cur_archive_file_ofs += local_dir_footer_size;
    }

    if (pExtra_data != NULL)
    {
        extra_size = mz_zip_writer_create_zip64_extra_data(extra_data, (uncomp_size >= MZ_UINT32_MAX) ? &uncomp_size : NULL,
                                                           (uncomp_size >= MZ_UINT32_MAX) ? &comp_size : NULL, (local_dir_header_ofs >= MZ_UINT32_MAX) ? &local_dir_header_ofs : NULL);
    }

    if (!mz_zip_writer_add_to_central_dir(pZip, pArchive_name, (mz_uint16)archive_name_size, pExtra_data, extra_size, pComment, comment_size,
                                          uncomp_size, comp_size, uncomp_crc32, method, gen_flags, dos_time, dos_date, local_dir_header_ofs, ext_attributes,
                                          user_extra_data_central, user_extra_data_central_len))
        return MZ_FALSE;

    pZip->m_total_files++;
    pZip->m_archive_size = cur_archive_file_ofs;

    return MZ_TRUE;
}